

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::SetExpressionRequest>::construct
          (BasicTypeInfo<dap::SetExpressionRequest> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::SetExpressionRequest> *this_local;
  
  memset(ptr,0,0x58);
  SetExpressionRequest::SetExpressionRequest((SetExpressionRequest *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }